

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.cpp
# Opt level: O2

void lsvm::hashmap::copy_into_new_bucket
               (hashmap *h,hashbucket **pb,hashbucket **b,uint32_t new_size_indx)

{
  int iVar1;
  hashbucket *ptr;
  hashbucket *phVar2;
  
  ptr = *b;
  *b = ptr->next;
  add_new_bucket(h,pb,(uint8_t)new_size_indx);
  h->count = h->count - ptr->count;
  balance_partition(pb);
  iVar1 = (&primes)[ptr->bucket_size_indx];
  for (phVar2 = ptr + 1; phVar2 <= (hashbucket *)((long)ptr + (ulong)(iVar1 - 1) * 0x18 + 0x10);
      phVar2 = (hashbucket *)&phVar2[1].count) {
    if (*(void **)&phVar2->count != (void *)0x0) {
      insert_into_partition
                (h,(hash)phVar2->next,h->bits & (ushort)phVar2->next,*(void **)&phVar2->count,
                 phVar2[1].next,true);
    }
  }
  memory::retain(ptr);
  balance_partition(pb);
  return;
}

Assistant:

inline void copy_into_new_bucket(hashmap* h, hashbucket** pb, hashbucket** b, uint32_t new_size_indx){

    // remove current bucket from partition and add new bigger one
    hashbucket* ob = *b;
    *b = (*b)->next;
    add_new_bucket(h,pb,new_size_indx);
    h->count -= ob->count;
    
    // rebalance partition
    balance_partition(pb);

    // insert left-over keys into partition
    entry* he = entries(ob); 
    entry* ehe = get_entry(ob,bucket_size(ob)-1); 
    while(he <= ehe){
        if(he->key != null){
            insert_into_partition(h,he->keyhash,hashbit(he->keyhash,h->bits),he->key,he->val,true);
        }
        ++he;
    }
    
    // remove old bucket
    lsvm::memory::retain(ob);

    // rebalance partition
    balance_partition(pb);
}